

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_kvs_close(fdb_kvs_handle *handle)

{
  fdb_kvs_handle *in_RDI;
  fdb_status fs;
  char *in_stack_00000010;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  fdb_status fVar1;
  
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    fVar1 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RDI->num_iterators == 0) {
    if ((in_RDI->shandle == (snap_handle *)0x0) || (in_RDI->kvs != (kvs_info *)0x0)) {
      if ((in_RDI->kvs == (kvs_info *)0x0) || (in_RDI->kvs->type == '\0')) {
        if (in_RDI->fhandle->root == in_RDI) {
          fdb_assert_die(in_stack_00000010,(char *)handle,fs,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (uint64_t)in_RDI);
        }
        pthread_spin_lock(&in_RDI->fhandle->lock);
        fVar1 = _fdb_close((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (fVar1 == FDB_RESULT_SUCCESS) {
          if (in_RDI->kvs != (kvs_info *)0x0) {
            fdb_kvs_info_free((fdb_kvs_handle *)0x1644a5);
          }
          list_remove(in_RDI->fhandle->handles,&in_RDI->node->le);
          pthread_spin_unlock(&in_RDI->fhandle->lock);
          free(in_RDI->node);
          free(in_RDI);
        }
        else {
          pthread_spin_unlock(&in_RDI->fhandle->lock);
        }
      }
      else if ((in_RDI->kvs == (kvs_info *)0x0) || (in_RDI->kvs->root != (fdb_kvs_handle *)0x0)) {
        fVar1 = _fdb_kvs_close(in_RDI);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          fdb_kvs_info_free((fdb_kvs_handle *)0x164557);
          free(in_RDI);
        }
      }
      else {
        fVar1 = FDB_RESULT_INVALID_ARGS;
      }
    }
    else {
      fVar1 = _fdb_close((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (fVar1 == FDB_RESULT_SUCCESS) {
        free(in_RDI);
      }
    }
  }
  else {
    fVar1 = FDB_RESULT_KV_STORE_BUSY;
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_kvs_close(fdb_kvs_handle *handle)
{
    fdb_status fs;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }
    if (handle->num_iterators) {
        // There are still active iterators created from this handle
        return FDB_RESULT_KV_STORE_BUSY;
    }

    if (handle->shandle && handle->kvs == NULL) {
        // snapshot of the default KV store + single KV store mode
        // directly close handle
        // (snapshot of the other KV stores will be closed
        //  using _fdb_kvs_close(...) below)
        fs = _fdb_close(handle);
        if (fs == FDB_RESULT_SUCCESS) {
            free(handle);
        }
        return fs;
    }

    if (handle->kvs == NULL ||
        handle->kvs->type == KVS_ROOT) {
        // the default KV store handle

        fdb_assert(handle->fhandle->root != handle, handle, NULL);
        // the default KV store but not the root handle .. normally close
        spin_lock(&handle->fhandle->lock);
        fs = _fdb_close(handle);
        if (fs == FDB_RESULT_SUCCESS) {
            // remove from 'handles' list in the root node
            if (handle->kvs) {
                fdb_kvs_info_free(handle);
            }
            list_remove(handle->fhandle->handles, &handle->node->le);
            spin_unlock(&handle->fhandle->lock);
            free(handle->node);
            free(handle);
        } else {
            spin_unlock(&handle->fhandle->lock);
        }
        return fs;
    }

    if (handle->kvs && handle->kvs->root == NULL) {
        return FDB_RESULT_INVALID_ARGS;
    }
    fs = _fdb_kvs_close(handle);
    if (fs == FDB_RESULT_SUCCESS) {
        fdb_kvs_info_free(handle);
        free(handle);
    }
    return fs;
}